

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::runSingleRead
          (InterCallTestCase *this,int targetHandle,int stepNdx,int *programFriendlyName,
          int *resultStorageFriendlyName)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  reference ppSVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  long local_30;
  Functions *gl;
  int *resultStorageFriendlyName_local;
  int *programFriendlyName_local;
  int stepNdx_local;
  int targetHandle_local;
  InterCallTestCase *this_local;
  
  gl = (Functions *)resultStorageFriendlyName;
  resultStorageFriendlyName_local = programFriendlyName;
  programFriendlyName_local._0_4_ = stepNdx;
  programFriendlyName_local._4_4_ = targetHandle;
  _stepNdx_local = this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_30 = CONCAT44(extraout_var,iVar2);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [18])"Running program #");
  *resultStorageFriendlyName_local = *resultStorageFriendlyName_local + 1;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,resultStorageFriendlyName_local);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])" to verify ");
  local_1c8[0] = "image";
  if (this->m_storage == STORAGE_BUFFER) {
    local_1c8[0] = "buffer";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c8);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c126a3);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)((long)&programFriendlyName_local + 4));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c89945);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [37])"\tWriting results to result storage #");
  *(int *)&gl->activeShaderProgram = *(int *)&gl->activeShaderProgram + 1;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)gl);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c89945);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"\tDispatch size: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_invocationGridSize);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a9098a);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_invocationGridSize);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b6cb9a);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  pcVar1 = *(code **)(local_30 + 0x1680);
  ppSVar6 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::operator[]
                      (&this->m_operationPrograms,(long)(int)programFriendlyName_local);
  dVar3 = glu::ShaderProgram::getProgram(*ppSVar6);
  (*pcVar1)(dVar3);
  if (this->m_storage == STORAGE_BUFFER) {
    pcVar1 = *(code **)(local_30 + 0x48);
    pmVar7 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,
                          (key_type_conflict *)((long)&programFriendlyName_local + 4));
    (*pcVar1)(0x90d2,1,*pmVar7);
    dVar3 = (**(code **)(local_30 + 0x800))();
    glu::checkError(dVar3,"bind source buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x653);
  }
  else if (this->m_storage == STORAGE_IMAGE) {
    pcVar1 = *(code **)(local_30 + 0x80);
    pmVar7 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,
                          (key_type_conflict *)((long)&programFriendlyName_local + 4));
    uVar9 = 35000;
    if ((this->m_useAtomic & 1U) != 0) {
      uVar9 = 0x88ba;
    }
    uVar10 = 0x822e;
    if ((this->m_formatInteger & 1U) != 0) {
      uVar10 = 0x8235;
    }
    (*pcVar1)(1,*pmVar7,0,0,0,uVar9,uVar10);
    dVar3 = (**(code **)(local_30 + 0x800))();
    glu::checkError(dVar3,"bind source image",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x65a);
  }
  pcVar1 = *(code **)(local_30 + 0x48);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_operationResultStorages,(long)(int)programFriendlyName_local);
  (*pcVar1)(0x90d2,0,*pvVar8);
  dVar3 = (**(code **)(local_30 + 0x800))();
  glu::checkError(dVar3,"bind result buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x662);
  (**(code **)(local_30 + 0x528))(this->m_invocationGridSize,this->m_invocationGridSize,1);
  dVar3 = (**(code **)(local_30 + 0x800))();
  glu::checkError(dVar3,"dispatch read",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x666);
  return;
}

Assistant:

void InterCallTestCase::runSingleRead (int targetHandle, int stepNdx, int& programFriendlyName, int& resultStorageFriendlyName)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Running program #" << ++programFriendlyName << " to verify " << ((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) << " #" << targetHandle << ".\n"
		<< "	Writing results to result storage #" << ++resultStorageFriendlyName << ".\n"
		<< "	Dispatch size: " << m_invocationGridSize << "x" << m_invocationGridSize << "."
		<< tcu::TestLog::EndMessage;

	gl.useProgram(m_operationPrograms[stepNdx]->getProgram());

	// set source
	if (m_storage == STORAGE_BUFFER)
	{
		DE_ASSERT(m_storageIDs[targetHandle]);

		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storageIDs[targetHandle]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source buffer");
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		DE_ASSERT(m_storageIDs[targetHandle]);

		gl.bindImageTexture(1, m_storageIDs[targetHandle], 0, GL_FALSE, 0, (m_useAtomic) ? (GL_READ_WRITE) : (GL_READ_ONLY), (m_formatInteger) ? (GL_R32I) : (GL_R32F));
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source image");
	}
	else
		DE_ASSERT(DE_FALSE);

	// set destination
	DE_ASSERT(m_operationResultStorages[stepNdx]);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_operationResultStorages[stepNdx]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind result buffer");

	// calc
	gl.dispatchCompute(m_invocationGridSize, m_invocationGridSize, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatch read");
}